

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMiscTest_ParsePublicImports_Test::
ParseMiscTest_ParsePublicImports_Test(ParseMiscTest_ParsePublicImports_Test *this)

{
  ParseMiscTest_ParsePublicImports_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseMiscTest);
  (this->super_ParseMiscTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseMiscTest_ParsePublicImports_Test_02a0bae0;
  return;
}

Assistant:

TEST_F(ParseMiscTest, ParsePublicImports) {
  ExpectParsesTo(
      "import \"foo.proto\";\n"
      "import public \"bar.proto\";\n"
      "import \"baz.proto\";\n"
      "import public \"qux.proto\";\n",
      "dependency: \"foo.proto\""
      "dependency: \"bar.proto\""
      "dependency: \"baz.proto\""
      "dependency: \"qux.proto\""
      "public_dependency: 1 "
      "public_dependency: 3 ");
}